

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O0

void __thiscall
mxx::custom_op<float,true>::custom_op<float_const&(*)(float_const&,float_const&)>
          (custom_op<float,true> *this,_func_float_ptr_float_ptr_float_ptr *func)

{
  MPI_Op poVar1;
  MPI_Datatype poVar2;
  int local_74;
  undefined1 local_70 [8];
  datatype dt_1;
  undefined1 local_48 [8];
  datatype dt;
  MPI_Op op;
  _func_float_ptr_float_ptr_float_ptr *func_local;
  custom_op<float,_true> *this_local;
  
  *(undefined ***)this = &PTR__custom_op_00295670;
  op = (MPI_Op)func;
  func_local = (_func_float_ptr_float_ptr_float_ptr *)this;
  std::function<void_(void_*,_void_*,_int_*)>::function
            ((function<void_(void_*,_void_*,_int_*)> *)(this + 8));
  this[0x28] = (custom_op<float,true>)0x0;
  poVar1 = get_builtin_op<float,_const_float_&(*)(const_float_&,_const_float_&)>::op
                     ((_func_float_ptr_float_ptr_float_ptr *)op);
  if (poVar1 != (MPI_Op)&ompi_mpi_op_null) {
    this[0x28] = (custom_op<float,true>)0x1;
    *(MPI_Op *)(this + 0x38) = poVar1;
    get_datatype<float>();
    poVar2 = mxx::datatype::type((datatype *)local_48);
    *(MPI_Datatype *)(this + 0x30) = poVar2;
    mxx::datatype::~datatype((datatype *)local_48);
  }
  if (((byte)this[0x28] & 1) == 0) {
    std::
    bind<void(&)(float_const&(*)(float_const&,float_const&),void*,void*,int*),float_const&(*)(float_const&,float_const&),std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::_Placeholder<3>const&>
              ((_func_void__func_float_ptr_float_ptr_float_ptr_ptr_void_ptr_void_ptr_int_ptr *)
               &dt_1.builtin,
               (_func_float_ptr_float_ptr_float_ptr **)
               custom_function<float_const&(*)(float_const&,float_const&)>,(_Placeholder<1> *)&op,
               (_Placeholder<2> *)&std::placeholders::_1,(_Placeholder<3> *)&std::placeholders::_2);
    std::function<void(void*,void*,int*)>::operator=
              ((function<void(void*,void*,int*)> *)(this + 8),
               (_Bind<void_(*(const_float_&(*)(const_float_&,_const_float_&),_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_float_&(*)(const_float_&,_const_float_&),_void_*,_void_*,_int_*)>
                *)&dt_1.builtin);
    get_datatype<float>();
    poVar2 = mxx::datatype::type((datatype *)local_70);
    MPI_Type_dup(poVar2,this + 0x30);
    local_74 = 0x543;
    attr_map<int,_std::function<void_(void_*,_void_*,_int_*)>_>::set
              ((MPI_Datatype *)(this + 0x30),&local_74,
               (function<void_(void_*,_void_*,_int_*)> *)(this + 8));
    MPI_Op_create(custom_op<float,_true>::mpi_user_function,1,this + 0x38);
    mxx::datatype::~datatype((datatype *)local_70);
  }
  return;
}

Assistant:

custom_op(Func func) : m_builtin(false) {
        if (mxx::is_builtin_type<T>::value) {
            // check if the operator is MPI built-in (in case the type
            // is also a MPI built-in type)
            MPI_Op op = get_builtin_op<T, Func>::op(std::forward<Func>(func));
            if (op != MPI_OP_NULL) {
                // this op is builtin, save it as such and don't copy built-in type
                m_builtin = true;
                m_op = op;
                mxx::datatype dt = mxx::get_datatype<T>();
                m_type_copy = dt.type();
            }
        }
        if (!m_builtin) {
            // create user function
            using namespace std::placeholders;
            m_user_func = std::bind(custom_op::custom_function<Func>,
                                  std::forward<Func>(func), _1, _2, _3);
            // get datatype associated with the type `T`
            mxx::datatype dt = mxx::get_datatype<T>();
            // attach function to a copy of the datatype
            MPI_Type_dup(dt.type(), &m_type_copy);
            attr_map<int, func_t>::set(m_type_copy, 1347, m_user_func);
            // create op
            MPI_Op_create(&custom_op::mpi_user_function, IsCommutative, &m_op);
        }
    }